

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::OP_SetElementI_UInt32
               (Var instance,uint32 index,Var value,ScriptContext *scriptContext,
               PropertyOperationFlags flags)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint64 uVar4;
  uint64 uVar5;
  undefined4 *puVar6;
  Var index_00;
  double value_00;
  
  if ((int)index < 0) {
    value_00 = (double)index;
    uVar4 = NumberUtilities::ToSpecial(value_00);
    bVar2 = NumberUtilities::IsNan(value_00);
    if (bVar2) {
      uVar5 = NumberUtilities::ToSpecial(value_00);
      if (uVar5 != 0xfff8000000000000) {
        uVar5 = NumberUtilities::ToSpecial(value_00);
        if (uVar5 != 0x7ff8000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar6 = 0;
        }
      }
    }
    index_00 = (Var)(uVar4 ^ 0xfffc000000000000);
  }
  else {
    index_00 = (Var)((ulong)index | 0x1000000000000);
  }
  BVar3 = OP_SetElementI_JIT(instance,index_00,value,scriptContext,flags);
  return BVar3;
}

Assistant:

BOOL JavascriptOperators::OP_SetElementI_UInt32(Var instance, uint32 index, Var value, ScriptContext* scriptContext, PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_SetElementI_UInt32);
        JIT_HELPER_SAME_ATTRIBUTES(Op_SetElementI_UInt32, Op_SetElementI);
#if FLOATVAR
        return OP_SetElementI_JIT(instance, Js::JavascriptNumber::ToVar(index, scriptContext), value, scriptContext, flags);
#else
        char buffer[sizeof(Js::JavascriptNumber)];
        return OP_SetElementI_JIT(instance, Js::JavascriptNumber::ToVarInPlace(index, scriptContext,
            (Js::JavascriptNumber *)buffer), value, scriptContext, flags);
#endif
        JIT_HELPER_END(Op_SetElementI_UInt32);
    }